

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Sub::
Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
          (Sub *this,string *key,anon_class_16_2_fd512ddd_for_cb *value)

{
  anon_class_16_2_fd512ddd_for_cb *value_local;
  string *key_local;
  Sub *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  ValueImpl<true>::
  ValueImpl<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&,void>
            (&this->value_,value);
  std::optional<google::protobuf::io::Printer::AnnotationRecord>::optional(&this->annotation_);
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}